

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O0

drwav * drwav_open_file_write__internal
                  (char *filename,drwav_data_format *pFormat,drwav_uint64 totalSampleCount,
                  drwav_bool32 isSequential)

{
  FILE *__stream;
  undefined4 in_ECX;
  drwav_write_proc in_RDX;
  undefined8 in_RSI;
  drwav_bool32 isSequential_00;
  drwav_uint64 in_RDI;
  drwav *pWav;
  FILE *pFile;
  char *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  drwav_data_format *in_stack_fffffffffffffff8;
  drwav *pdVar1;
  
  isSequential_00 = (drwav_bool32)((ulong)in_RSI >> 0x20);
  __stream = (FILE *)drwav_fopen((char *)CONCAT44(in_ECX,in_stack_ffffffffffffffd8),
                                 in_stack_ffffffffffffffd0);
  if (__stream == (FILE *)0x0) {
    pdVar1 = (drwav *)0x0;
  }
  else {
    pdVar1 = drwav_open_write__internal
                       (in_stack_fffffffffffffff8,in_RDI,isSequential_00,in_RDX,
                        (drwav_seek_proc)CONCAT44(in_ECX,in_stack_ffffffffffffffd8),__stream);
    if (pdVar1 == (drwav *)0x0) {
      fclose(__stream);
      pdVar1 = (drwav *)0x0;
    }
  }
  return pdVar1;
}

Assistant:

drwav* drwav_open_file_write__internal(const char* filename, const drwav_data_format* pFormat, drwav_uint64 totalSampleCount, drwav_bool32 isSequential)
{
    FILE* pFile = drwav_fopen(filename, "wb");
    if (pFile == NULL) {
        return DRWAV_FALSE;
    }

    drwav* pWav = drwav_open_write__internal(pFormat, totalSampleCount, isSequential, drwav__on_write_stdio, drwav__on_seek_stdio, (void*)pFile);
    if (pWav == NULL) {
        fclose(pFile);
        return NULL;
    }

    return pWav;
}